

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  pointer ppIVar1;
  undefined8 *__src;
  string *psVar2;
  size_type sVar3;
  size_type __n;
  pointer __dest;
  void *__dest_00;
  size_t sVar4;
  
  ppIVar1 = (this->m_translators).
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar1 !=
      (this->m_translators).
      super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (*(*ppIVar1)->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,*ppIVar1,ppIVar1 + 1);
    return __return_storage_ptr__;
  }
  __cxa_rethrow();
  __src = (undefined8 *)__return_storage_ptr__->_M_string_length;
  if (__src != (undefined8 *)(__return_storage_ptr__->field_2)._M_allocated_capacity) {
    psVar2 = (string *)(this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry
    ;
    *__src = psVar2;
    __return_storage_ptr__->_M_string_length = __return_storage_ptr__->_M_string_length + 8;
    return psVar2;
  }
  __n = std::
        vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
        ::_M_check_len((vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                        *)__return_storage_ptr__,1,"vector::_M_realloc_insert");
  ppIVar1 = (pointer)(__return_storage_ptr__->_M_dataplus)._M_p;
  sVar3 = __return_storage_ptr__->_M_string_length;
  sVar4 = (long)__src - (long)ppIVar1;
  __dest = std::
           _Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
           ::_M_allocate((_Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                          *)__return_storage_ptr__,__n);
  *(_func_int ***)((long)__dest + sVar4) =
       (this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry;
  if (0 < (long)sVar4) {
    memmove(__dest,ppIVar1,sVar4);
  }
  __dest_00 = (void *)((long)__dest + sVar4 + 8);
  sVar4 = sVar3 - (long)__src;
  if (0 < (long)sVar4) {
    memmove(__dest_00,__src,sVar4);
  }
  std::
  _Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ::_M_deallocate((_Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                   *)__return_storage_ptr__,ppIVar1,
                  (long)((__return_storage_ptr__->field_2)._M_allocated_capacity - (long)ppIVar1) >>
                  3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)__dest;
  __return_storage_ptr__->_M_string_length = (long)__dest_00 + sVar4;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)(__dest + __n);
  return (string *)(__dest + __n);
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }